

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# route.cpp
# Opt level: O0

void __thiscall httprouter::node::node(node *this)

{
  _tree_node *__p;
  allocator local_25 [20];
  allocator local_11;
  node *local_10;
  node *this_local;
  
  local_10 = this;
  __p = (_tree_node *)operator_new(0x78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__p,"",&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&__p->indices,"",local_25);
  (__p->children).
  super__Vector_base<std::shared_ptr<httprouter::_tree_node>,_std::allocator<std::shared_ptr<httprouter::_tree_node>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->children).
  super__Vector_base<std::shared_ptr<httprouter::_tree_node>,_std::allocator<std::shared_ptr<httprouter::_tree_node>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->children).
  super__Vector_base<std::shared_ptr<httprouter::_tree_node>,_std::allocator<std::shared_ptr<httprouter::_tree_node>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<httprouter::_tree_node>,_std::allocator<std::shared_ptr<httprouter::_tree_node>_>_>
  ::vector(&__p->children);
  std::function<void_(HttpRequest_&)>::function(&__p->handle,(nullptr_t)0x0);
  std::shared_ptr<httprouter::_tree_node>::shared_ptr<httprouter::_tree_node,void>(&this->node_,__p)
  ;
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  return;
}

Assistant:

node::node()
	:node_(new tree_node_t{
	  path:       "",
	  indices:    "",
	  children:   {},
	  handle:     nullptr,
		})
{
}